

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_utils.c
# Opt level: O1

_Bool utf8_reverse(char *p)

{
  byte *pbVar1;
  ushort *puVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  byte *pbVar6;
  byte *pbVar7;
  uint uVar8;
  
  string_reverse(p);
  pbVar7 = (byte *)p;
  if (p != (char *)0x0) {
    pbVar6 = (byte *)(p + -1);
    do {
      pbVar7 = pbVar6 + 1;
      pbVar1 = pbVar6 + 1;
      pbVar6 = pbVar7;
    } while (*pbVar1 != 0);
  }
  while( true ) {
    do {
      while( true ) {
        while( true ) {
          pbVar6 = pbVar7;
          pbVar7 = pbVar6 + -1;
          bVar5 = pbVar7 <= p;
          if (pbVar7 <= p) {
            return bVar5;
          }
          bVar3 = pbVar6[-1];
          uVar8 = (uint)(bVar3 >> 4);
          if (1 < uVar8 - 0xc) break;
          if (pbVar7 == (byte *)p || (long)pbVar7 - (long)p < 0) {
            return bVar5;
          }
          bVar4 = pbVar6[-2];
          *pbVar7 = bVar4 ^ bVar3;
          pbVar6[-2] = bVar3;
          *pbVar7 = bVar4;
          pbVar7 = pbVar6 + -2;
        }
        if (uVar8 != 0xe) break;
        if ((long)pbVar7 - (long)p < 3) {
          return bVar5;
        }
        bVar4 = pbVar6[-3];
        *pbVar7 = bVar4 ^ bVar3;
        pbVar6[-3] = bVar3;
        *pbVar7 = bVar4;
        pbVar7 = pbVar6 + -3;
      }
    } while (uVar8 != 0xf);
    if ((long)pbVar7 - (long)p < 4) break;
    bVar4 = pbVar6[-4];
    *pbVar7 = bVar4 ^ bVar3;
    pbVar6[-4] = bVar3;
    *pbVar7 = bVar4;
    puVar2 = (ushort *)(pbVar6 + -3);
    *puVar2 = *puVar2 << 8 | *puVar2 >> 8;
    pbVar7 = pbVar6 + -4;
  }
  return bVar5;
}

Assistant:

bool utf8_reverse (char *p) {
    char *q = p;
    string_reverse(p);
    
    // now fix bass-ackwards UTF chars.
    while(q && *q) ++q; // find eos
    while(p < --q)
        switch( (*q & 0xF0) >> 4 ) {
            case 0xF: /* U+010000-U+10FFFF: four bytes. */
                if (q-p < 4) return false;
                SWP(*(q-0), *(q-3));
                SWP(*(q-1), *(q-2));
                q -= 3;
                break;
            case 0xE: /* U+000800-U+00FFFF: three bytes. */
                if (q-p < 3) return false;
                SWP(*(q-0), *(q-2));
                q -= 2;
                break;
            case 0xC: /* fall-through */
            case 0xD: /* U+000080-U+0007FF: two bytes. */
                if (q-p < 1) return false;
                SWP(*(q-0), *(q-1));
                q--;
                break;
        }
    return true;
}